

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_genericmodel.cpp
# Opt level: O2

void __thiscall tst_GenericModel::moveRowsExistingBranch(tst_GenericModel *this)

{
  long lVar1;
  char cVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  QModelIndex *pQVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  long lVar11;
  QChar local_1e4;
  QChar local_1e2;
  value_type args;
  anon_union_24_3_e3d07ef4_for_data local_1c0;
  GenericModel testModel;
  QModelIndex destIndex;
  QModelIndex parIndex;
  QPersistentModelIndex twoIndex;
  QSignalSpy *spyArr [2];
  ModelTest probe;
  QSignalSpy rowsAboutToBeMovedSpy;
  QSignalSpy rowsMovedSpy;
  
  GenericModel::GenericModel(&testModel,(QObject *)0x0);
  ModelTest::ModelTest(&probe,(QAbstractItemModel *)&testModel,(QObject *)0x0);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x3);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&parIndex,(int)&testModel,(QModelIndex *)0x1);
  rowsAboutToBeMovedSpy.super_QObject = (QObject)0xff;
  rowsAboutToBeMovedSpy._1_7_ = 0xffffffffffffff;
  rowsAboutToBeMovedSpy._8_8_ = 0;
  rowsAboutToBeMovedSpy.super_QList<QList<QVariant>_>.d.d = (Data *)0x0;
  GenericModel::index((int)&destIndex,(int)&testModel,(QModelIndex *)0x2);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x6);
  GenericModel::insertColumns((int)&testModel,0,(QModelIndex *)0x2);
  GenericModel::insertRows((int)&testModel,0,(QModelIndex *)0x6);
  QSignalSpy::QSignalSpy
            (&rowsAboutToBeMovedSpy,(QObject *)&testModel,
             "2rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsAboutToBeMovedSpy.sig.d.size != 0,"rowsAboutToBeMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x753);
  if (cVar2 == '\0') goto LAB_00122c1f;
  QSignalSpy::QSignalSpy
            (&rowsMovedSpy,(QObject *)&testModel,
             "2rowsMoved(QModelIndex, int, int, QModelIndex, int)");
  cVar2 = QTest::qVerify(rowsMovedSpy.sig.d.size != 0,"rowsMovedSpy.isValid()","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x755);
  if (cVar2 != '\0') {
    pQVar7 = (QModelIndex *)0x0;
    spyArr[0] = &rowsAboutToBeMovedSpy;
    spyArr[1] = &rowsMovedSpy;
    for (iVar10 = -6; iVar10 != 0; iVar10 = iVar10 + 1) {
      iVar6 = (int)pQVar7;
      iVar8 = (int)(QModelIndex *)&testModel;
      iVar9 = (int)&local_1c0;
      GenericModel::index(iVar9,iVar8,pQVar7);
      QVariant::QVariant((QVariant *)&args,iVar6);
      iVar5 = (int)(QVariant *)&args;
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_1c0,iVar5);
      QVariant::~QVariant((QVariant *)&args);
      GenericModel::index(iVar9,iVar8,pQVar7);
      QVariant::QVariant((QVariant *)&args,(QChar)((short)iVar10 + L'g'));
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_1c0,iVar5);
      QVariant::~QVariant((QVariant *)&args);
      GenericModel::index(iVar9,iVar8,pQVar7);
      QVariant::QVariant((QVariant *)&args,iVar6 + 10);
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_1c0,iVar5);
      QVariant::~QVariant((QVariant *)&args);
      GenericModel::index(iVar9,iVar8,pQVar7);
      QVariant::QVariant((QVariant *)&args,(QChar)((short)iVar10 + L'q'));
      GenericModel::setData((QModelIndex *)&testModel,(QVariant *)&local_1c0,iVar5);
      QVariant::~QVariant((QVariant *)&args);
      pQVar7 = (QModelIndex *)(ulong)(iVar6 + 1);
    }
    bVar3 = GenericModel::moveRows
                      ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,(int)&destIndex
                      );
    cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 2, 1, destIndex, -1)",""
                           ,
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                           ,0x75e);
    if (cVar2 != '\0') {
      lVar11 = 0;
      do {
        if (lVar11 == 0x10) {
          bVar3 = GenericModel::moveRows
                            ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x1,
                             (int)&destIndex);
          cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),
                                 "!testModel.moveRows(parIndex, 2, 1, destIndex, 7)","",
                                 "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                 ,0x761);
          if (cVar2 != '\0') {
            lVar11 = 0;
            goto LAB_00121c15;
          }
          break;
        }
        cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar11) + 0x20),0,
                                "spy->count()","0",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                                ,0x760);
        lVar11 = lVar11 + 8;
      } while (cVar2 != '\0');
    }
  }
  goto LAB_00122c12;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar11) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x763);
    lVar11 = lVar11 + 8;
    if (cVar2 == '\0') break;
LAB_00121c15:
    if (lVar11 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,-1,(QModelIndex *)0x1,
                         (int)&destIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, -1, 1, destIndex, 1)",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x764);
      if (cVar2 != '\0') {
        lVar11 = 0;
        goto LAB_00121cac;
      }
      break;
    }
  }
  goto LAB_00122c12;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar11) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x766);
    lVar11 = lVar11 + 8;
    if (cVar2 == '\0') break;
LAB_00121cac:
    if (lVar11 == 0x10) {
      bVar3 = GenericModel::moveRows
                        ((QModelIndex *)&testModel,(int)&parIndex,6,(QModelIndex *)0x1,
                         (int)&destIndex);
      cVar2 = QTest::qVerify((bool)(bVar3 ^ 1),"!testModel.moveRows(parIndex, 6, 1, destIndex, 1)",
                             "",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x767);
      if (cVar2 != '\0') {
        lVar11 = 0;
        goto LAB_00121d43;
      }
      break;
    }
  }
  goto LAB_00122c12;
  while( true ) {
    cVar2 = QTest::qCompare(*(longlong *)(*(long *)((long)spyArr + lVar11) + 0x20),0,"spy->count()",
                            "0",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x769);
    lVar11 = lVar11 + 8;
    if (cVar2 == '\0') break;
LAB_00121d43:
    if (lVar11 == 0x10) {
      GenericModel::index((int)&args,(int)&testModel,(QModelIndex *)0x2);
      QPersistentModelIndex::QPersistentModelIndex(&twoIndex,(QModelIndex *)&args);
      bVar4 = (bool)GenericModel::moveRows
                              ((QModelIndex *)&testModel,(int)&parIndex,2,(QModelIndex *)0x2,
                               (int)&destIndex);
      cVar2 = QTest::qVerify(bVar4,"testModel.moveRows(parIndex, 2, 2, destIndex, 1)","",
                             "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                             ,0x76c);
      if (cVar2 == '\0') goto LAB_00122c05;
      iVar10 = GenericModel::rowCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar10,8,"testModel.rowCount(destIndex)","8",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x76d);
      if (cVar2 == '\0') goto LAB_00122c05;
      iVar10 = GenericModel::columnCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar10,2,"testModel.columnCount(destIndex)","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x76e);
      if (cVar2 == '\0') goto LAB_00122c05;
      iVar10 = GenericModel::rowCount((QModelIndex *)&testModel);
      cVar2 = QTest::qCompare(iVar10,4,"testModel.rowCount(parIndex)","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x76f);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,0,"testModel.index(0, 0, parIndex).data().toInt()","0",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x770);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,1,"testModel.index(1, 0, parIndex).data().toInt()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x771);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,4,"testModel.index(2, 0, parIndex).data().toInt()","4",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x772);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,5,"testModel.index(3, 0, parIndex).data().toInt()","5",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x773);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,10,"testModel.index(0, 0, destIndex).data().toInt()","10",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x774);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,2,"testModel.index(1, 0, destIndex).data().toInt()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x775);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,3,"testModel.index(2, 0, destIndex).data().toInt()","3",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x776);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,0xb,"testModel.index(3, 0, destIndex).data().toInt()","11",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x777);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,0xc,"testModel.index(4, 0, destIndex).data().toInt()","12",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x778);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,0xd,"testModel.index(5, 0, destIndex).data().toInt()","13",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x779);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x6);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,0xe,"testModel.index(6, 0, destIndex).data().toInt()","14",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x77a);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x7);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      iVar10 = QVariant::toInt((bool *)&args);
      cVar2 = QTest::qCompare(iVar10,0xf,"testModel.index(7, 0, destIndex).data().toInt()","15",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x77b);
      QVariant::~QVariant((QVariant *)&args);
      if (cVar2 == '\0') goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'a';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(0, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'a\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x77c);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'b';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(1, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'b\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x77d);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'e';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(2, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'e\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x77e);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'f';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(3, 1, parIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'f\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x77f);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x0);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'k';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(0, 1, destIndex).data().value<QChar>()",
                         "QChar(\'a\' + 10)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x780);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x1);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(1, 1, destIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x781);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x2);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'd';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(2, 1, destIndex).data().value<QChar>()",
                         "QChar(QLatin1Char(\'d\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x782);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x3);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'l';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(3, 1, destIndex).data().value<QChar>()",
                         "QChar(\'b\' + 10)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x783);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x4);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'm';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(4, 1, destIndex).data().value<QChar>()",
                         "QChar(\'c\' + 10)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x784);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x5);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'n';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(5, 1, destIndex).data().value<QChar>()",
                         "QChar(\'d\' + 10)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x785);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x6);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'o';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(6, 1, destIndex).data().value<QChar>()",
                         "QChar(\'e\' + 10)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x786);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      GenericModel::index((int)&local_1c0,(int)&testModel,(QModelIndex *)0x7);
      QModelIndex::data((QVariant *)&args,(QModelIndex *)&local_1c0,0);
      local_1e4 = qvariant_cast<QChar>((QVariant *)&args);
      local_1e2.ucs = L'p';
      bVar4 = QTest::qCompare<QChar,QChar>
                        (&local_1e4,&local_1e2,
                         "testModel.index(7, 1, destIndex).data().value<QChar>()",
                         "QChar(\'f\' + 10)",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x787);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      QPersistentModelIndex::data((int)&args);
      local_1c0._0_2_ = qvariant_cast<QChar>((QVariant *)&args);
      local_1e4.ucs = L'c';
      bVar4 = QTest::qCompare<QChar,QChar>
                        ((QChar *)&local_1c0,&local_1e4,"twoIndex.data().value<QChar>()",
                         "QChar(QLatin1Char(\'c\'))",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x789);
      QVariant::~QVariant((QVariant *)&args);
      if (!bVar4) goto LAB_00122c05;
      iVar10 = QPersistentModelIndex::row();
      cVar2 = QTest::qCompare(iVar10,1,"twoIndex.row()","1",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                              ,0x78a);
      if (cVar2 == '\0') goto LAB_00122c05;
      QPersistentModelIndex::parent();
      bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                        ((QModelIndex *)&args,&destIndex,"twoIndex.parent()","destIndex",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                         ,0x78b);
      if (!bVar4) goto LAB_00122c05;
      lVar11 = 0;
      goto LAB_00122a8e;
    }
  }
  goto LAB_00122c12;
LAB_00122a8e:
  do {
    if (lVar11 == 0x10) break;
    lVar1 = *(long *)((long)spyArr + lVar11);
    cVar2 = QTest::qCompare(*(longlong *)(lVar1 + 0x20),1,"spy->count()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x78d);
    if (cVar2 == '\0') break;
    QList<QList<QVariant>_>::takeFirst
              ((value_type *)&args.d,(QList<QList<QVariant>_> *)(lVar1 + 0x10));
    qvariant_cast<QModelIndex>((QModelIndex *)&local_1c0,args.d.ptr);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      ((QModelIndex *)&local_1c0,&parIndex,"args.at(0).value<QModelIndex>()",
                       "parIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x78f);
    if (!bVar4) {
LAB_00122bfb:
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
      break;
    }
    iVar10 = QVariant::toInt((bool *)(args.d.ptr + 1));
    cVar2 = QTest::qCompare(iVar10,2,"args.at(1).toInt()","2",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x790);
    if (cVar2 == '\0') goto LAB_00122bfb;
    iVar10 = QVariant::toInt((bool *)(args.d.ptr + 2));
    cVar2 = QTest::qCompare(iVar10,3,"args.at(2).toInt()","3",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x791);
    if (cVar2 == '\0') goto LAB_00122bfb;
    qvariant_cast<QModelIndex>((QModelIndex *)&local_1c0,args.d.ptr + 3);
    bVar4 = QTest::qCompare<QModelIndex,QModelIndex>
                      ((QModelIndex *)&local_1c0,&destIndex,"args.at(3).value<QModelIndex>()",
                       "destIndex",
                       "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                       ,0x792);
    if (!bVar4) goto LAB_00122bfb;
    iVar10 = QVariant::toInt((bool *)(args.d.ptr + 4));
    cVar2 = QTest::qCompare(iVar10,1,"args.at(4).toInt()","1",
                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_GenericModel/tst_genericmodel.cpp"
                            ,0x793);
    QArrayDataPointer<QVariant>::~QArrayDataPointer(&args.d);
    lVar11 = lVar11 + 8;
  } while (cVar2 != '\0');
LAB_00122c05:
  QPersistentModelIndex::~QPersistentModelIndex(&twoIndex);
LAB_00122c12:
  QSignalSpy::~QSignalSpy(&rowsMovedSpy);
LAB_00122c1f:
  QSignalSpy::~QSignalSpy(&rowsAboutToBeMovedSpy);
  QObject::~QObject((QObject *)&probe);
  GenericModel::~GenericModel(&testModel);
  return;
}

Assistant:

void tst_GenericModel::moveRowsExistingBranch()
{
    GenericModel testModel;
    ModelTest probe(&testModel, nullptr);
    testModel.insertColumns(0, 2);
    testModel.insertRows(0, 3);
    const QModelIndex parIndex = testModel.index(1, 0);
    const QModelIndex destIndex = testModel.index(2, 0);
    testModel.insertColumns(0, 2, parIndex);
    testModel.insertRows(0, 6, parIndex);
    testModel.insertColumns(0, 2, destIndex);
    testModel.insertRows(0, 6, destIndex);
    QSignalSpy rowsAboutToBeMovedSpy(&testModel, SIGNAL(rowsAboutToBeMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsAboutToBeMovedSpy.isValid());
    QSignalSpy rowsMovedSpy(&testModel, SIGNAL(rowsMoved(QModelIndex, int, int, QModelIndex, int)));
    QVERIFY(rowsMovedSpy.isValid());
    QSignalSpy *spyArr[] = {&rowsAboutToBeMovedSpy, &rowsMovedSpy};
    for (int i = 0; i < 6; ++i) {
        testModel.setData(testModel.index(i, 0, parIndex), i);
        testModel.setData(testModel.index(i, 1, parIndex), QChar('a' + i));
        testModel.setData(testModel.index(i, 0, destIndex), 10 + i);
        testModel.setData(testModel.index(i, 1, destIndex), QChar('a' + i + 10));
    }

    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, -1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 2, 1, destIndex, 7));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, -1, 1, destIndex, 1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);
    QVERIFY(!testModel.moveRows(parIndex, 6, 1, destIndex, 1));
    for (QSignalSpy *spy : spyArr)
        QCOMPARE(spy->count(), 0);

    QPersistentModelIndex twoIndex = testModel.index(2, 1, parIndex);
    QVERIFY(testModel.moveRows(parIndex, 2, 2, destIndex, 1));
    QCOMPARE(testModel.rowCount(destIndex), 8);
    QCOMPARE(testModel.columnCount(destIndex), 2);
    QCOMPARE(testModel.rowCount(parIndex), 4);
    QCOMPARE(testModel.index(0, 0, parIndex).data().toInt(), 0);
    QCOMPARE(testModel.index(1, 0, parIndex).data().toInt(), 1);
    QCOMPARE(testModel.index(2, 0, parIndex).data().toInt(), 4);
    QCOMPARE(testModel.index(3, 0, parIndex).data().toInt(), 5);
    QCOMPARE(testModel.index(0, 0, destIndex).data().toInt(), 10);
    QCOMPARE(testModel.index(1, 0, destIndex).data().toInt(), 2);
    QCOMPARE(testModel.index(2, 0, destIndex).data().toInt(), 3);
    QCOMPARE(testModel.index(3, 0, destIndex).data().toInt(), 11);
    QCOMPARE(testModel.index(4, 0, destIndex).data().toInt(), 12);
    QCOMPARE(testModel.index(5, 0, destIndex).data().toInt(), 13);
    QCOMPARE(testModel.index(6, 0, destIndex).data().toInt(), 14);
    QCOMPARE(testModel.index(7, 0, destIndex).data().toInt(), 15);
    QCOMPARE(testModel.index(0, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('a')));
    QCOMPARE(testModel.index(1, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('b')));
    QCOMPARE(testModel.index(2, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('e')));
    QCOMPARE(testModel.index(3, 1, parIndex).data().value<QChar>(), QChar(QLatin1Char('f')));
    QCOMPARE(testModel.index(0, 1, destIndex).data().value<QChar>(), QChar('a' + 10));
    QCOMPARE(testModel.index(1, 1, destIndex).data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(testModel.index(2, 1, destIndex).data().value<QChar>(), QChar(QLatin1Char('d')));
    QCOMPARE(testModel.index(3, 1, destIndex).data().value<QChar>(), QChar('b' + 10));
    QCOMPARE(testModel.index(4, 1, destIndex).data().value<QChar>(), QChar('c' + 10));
    QCOMPARE(testModel.index(5, 1, destIndex).data().value<QChar>(), QChar('d' + 10));
    QCOMPARE(testModel.index(6, 1, destIndex).data().value<QChar>(), QChar('e' + 10));
    QCOMPARE(testModel.index(7, 1, destIndex).data().value<QChar>(), QChar('f' + 10));

    QCOMPARE(twoIndex.data().value<QChar>(), QChar(QLatin1Char('c')));
    QCOMPARE(twoIndex.row(), 1);
    QCOMPARE(twoIndex.parent(), destIndex);
    for (QSignalSpy *spy : spyArr) {
        QCOMPARE(spy->count(), 1);
        const auto args = spy->takeFirst();
        QCOMPARE(args.at(0).value<QModelIndex>(), parIndex);
        QCOMPARE(args.at(1).toInt(), 2);
        QCOMPARE(args.at(2).toInt(), 3);
        QCOMPARE(args.at(3).value<QModelIndex>(), destIndex);
        QCOMPARE(args.at(4).toInt(), 1);
    }
}